

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

TokenType soul::HEARTOperator::Matcher::match(UTF8Reader *text)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = ";";
  bVar1 = UTF8Reader::advanceIfStartsWith(text,";");
  if (!bVar1) {
    pcVar2 = ".";
    bVar1 = UTF8Reader::advanceIfStartsWith(text,".");
    if (!bVar1) {
      pcVar2 = ",";
      bVar1 = UTF8Reader::advanceIfStartsWith(text,",");
      if (!bVar1) {
        pcVar2 = "(";
        bVar1 = UTF8Reader::advanceIfStartsWith(text,"(");
        if (!bVar1) {
          pcVar2 = ")";
          bVar1 = UTF8Reader::advanceIfStartsWith(text,")");
          if (!bVar1) {
            pcVar2 = "{";
            bVar1 = UTF8Reader::advanceIfStartsWith(text,"{");
            if (!bVar1) {
              pcVar2 = "}";
              bVar1 = UTF8Reader::advanceIfStartsWith(text,"}");
              if (!bVar1) {
                pcVar2 = "[[";
                bVar1 = UTF8Reader::advanceIfStartsWith(text,"[[");
                if (!bVar1) {
                  pcVar2 = "]]";
                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"]]");
                  if (!bVar1) {
                    pcVar2 = "[";
                    bVar1 = UTF8Reader::advanceIfStartsWith(text,"[");
                    if (!bVar1) {
                      pcVar2 = "]";
                      bVar1 = UTF8Reader::advanceIfStartsWith(text,"]");
                      if (!bVar1) {
                        pcVar2 = "::";
                        bVar1 = UTF8Reader::advanceIfStartsWith(text,"::");
                        if (!bVar1) {
                          pcVar2 = ":";
                          bVar1 = UTF8Reader::advanceIfStartsWith(text,":");
                          if (!bVar1) {
                            pcVar2 = "?";
                            bVar1 = UTF8Reader::advanceIfStartsWith(text,"?");
                            if (!bVar1) {
                              pcVar2 = "#";
                              bVar1 = UTF8Reader::advanceIfStartsWith(text,"#");
                              if (!bVar1) {
                                pcVar2 = "==";
                                bVar1 = UTF8Reader::advanceIfStartsWith(text,"==");
                                if (!bVar1) {
                                  pcVar2 = "=";
                                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"=");
                                  if (!bVar1) {
                                    pcVar2 = "!=";
                                    bVar1 = UTF8Reader::advanceIfStartsWith(text,"!=");
                                    if (!bVar1) {
                                      pcVar2 = "!";
                                      bVar1 = UTF8Reader::advanceIfStartsWith(text,"!");
                                      if (!bVar1) {
                                        pcVar2 = "->";
                                        bVar1 = UTF8Reader::advanceIfStartsWith(text,"->");
                                        if (!bVar1) {
                                          pcVar2 = "-";
                                          bVar1 = UTF8Reader::advanceIfStartsWith(text,"-");
                                          if (!bVar1) {
                                            pcVar2 = "+";
                                            bVar1 = UTF8Reader::advanceIfStartsWith(text,"+");
                                            if (!bVar1) {
                                              pcVar2 = "*";
                                              bVar1 = UTF8Reader::advanceIfStartsWith(text,"*");
                                              if (!bVar1) {
                                                pcVar2 = "/";
                                                bVar1 = UTF8Reader::advanceIfStartsWith(text,"/");
                                                if (!bVar1) {
                                                  pcVar2 = "%";
                                                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"%");
                                                  if (!bVar1) {
                                                    pcVar2 = "^";
                                                    bVar1 = UTF8Reader::advanceIfStartsWith
                                                                      (text,"^");
                                                    if (!bVar1) {
                                                      pcVar2 = "~";
                                                      bVar1 = UTF8Reader::advanceIfStartsWith
                                                                        (text,"~");
                                                      if (!bVar1) {
                                                        pcVar2 = "&&";
                                                        bVar1 = UTF8Reader::advanceIfStartsWith
                                                                          (text,"&&");
                                                        if (!bVar1) {
                                                          pcVar2 = "&";
                                                          bVar1 = UTF8Reader::advanceIfStartsWith
                                                                            (text,"&");
                                                          if (!bVar1) {
                                                            pcVar2 = "||";
                                                            bVar1 = UTF8Reader::advanceIfStartsWith
                                                                              (text,"||");
                                                            if (!bVar1) {
                                                              pcVar2 = "|";
                                                              bVar1 = UTF8Reader::
                                                                      advanceIfStartsWith(text,"|");
                                                              if (!bVar1) {
                                                                pcVar2 = "<<";
                                                                bVar1 = UTF8Reader::
                                                                        advanceIfStartsWith(text,
                                                  "<<");
                                                  if (!bVar1) {
                                                    pcVar2 = "<=";
                                                    bVar1 = UTF8Reader::advanceIfStartsWith
                                                                      (text,"<=");
                                                    if (!bVar1) {
                                                      pcVar2 = "<-";
                                                      bVar1 = UTF8Reader::advanceIfStartsWith
                                                                        (text,"<-");
                                                      if (!bVar1) {
                                                        pcVar2 = "<";
                                                        bVar1 = UTF8Reader::advanceIfStartsWith
                                                                          (text,"<");
                                                        if (!bVar1) {
                                                          pcVar2 = ">>>";
                                                          bVar1 = UTF8Reader::advanceIfStartsWith
                                                                            (text,">>>");
                                                          if (!bVar1) {
                                                            pcVar2 = ">>";
                                                            bVar1 = UTF8Reader::advanceIfStartsWith
                                                                              (text,">>");
                                                            if (!bVar1) {
                                                              pcVar2 = ">=";
                                                              bVar1 = UTF8Reader::
                                                                      advanceIfStartsWith(text,">=")
                                                              ;
                                                              if (!bVar1) {
                                                                bVar1 = UTF8Reader::
                                                                        advanceIfStartsWith(text,">"
                                                  );
                                                  pcVar2 = (char *)0x0;
                                                  if (bVar1) {
                                                    pcVar2 = ">";
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (TokenType)pcVar2;
}

Assistant:

static TokenType match (UTF8Reader& text) noexcept
        {
            #define SOUL_COMPARE_OPERATOR(name, str) if (text.advanceIfStartsWith (str)) return name;
            SOUL_HEART_OPERATORS (SOUL_COMPARE_OPERATOR)
            #undef SOUL_COMPARE_OPERATOR
            return {};
        }